

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
spvtools::opt::DebugScope::ToBinary
          (DebugScope *this,uint32_t type_id,uint32_t result_id,uint32_t ext_set,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  bool bVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  uint local_4c;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  int local_3c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  bVar1 = this->lexical_scope_ == 0;
  local_4c = 0x5000c;
  if (!bVar1) {
    local_4c = (uint)(this->inlined_at_ != 0) << 0x10 | 0x6000c;
  }
  local_3c = bVar1 + 0x17;
  local_38._M_impl.super__Vector_impl_data._M_start = (uint *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = type_id;
  local_44 = result_id;
  local_40 = ext_set;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_38,&local_4c,&local_38);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,
             (const_iterator)
             (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38._M_impl.super__Vector_impl_data._M_finish);
  if (this->lexical_scope_ != 0) {
    local_4c = this->lexical_scope_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (binary,&local_4c);
    if (this->inlined_at_ != 0) {
      local_4c = this->inlined_at_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (binary,&local_4c);
    }
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void DebugScope::ToBinary(uint32_t type_id, uint32_t result_id,
                          uint32_t ext_set,
                          std::vector<uint32_t>* binary) const {
  uint32_t num_words = kDebugScopeNumWords;
  CommonDebugInfoInstructions dbg_opcode = CommonDebugInfoDebugScope;
  if (GetLexicalScope() == kNoDebugScope) {
    num_words = kDebugNoScopeNumWords;
    dbg_opcode = CommonDebugInfoDebugNoScope;
  } else if (GetInlinedAt() == kNoInlinedAt) {
    num_words = kDebugScopeNumWordsWithoutInlinedAt;
  }
  std::vector<uint32_t> operands = {
      (num_words << 16) | static_cast<uint16_t>(spv::Op::OpExtInst),
      type_id,
      result_id,
      ext_set,
      static_cast<uint32_t>(dbg_opcode),
  };
  binary->insert(binary->end(), operands.begin(), operands.end());
  if (GetLexicalScope() != kNoDebugScope) {
    binary->push_back(GetLexicalScope());
    if (GetInlinedAt() != kNoInlinedAt) binary->push_back(GetInlinedAt());
  }
}